

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parserInternals.c
# Opt level: O0

xmlParserInputPtr xmlNewInputFromFd(char *url,int fd,int flags)

{
  int iVar1;
  xmlParserInputBufferPtr buf_00;
  xmlParserInputBufferPtr buf;
  int flags_local;
  int fd_local;
  char *url_local;
  
  if (fd < 0) {
    url_local = (char *)0x0;
  }
  else {
    buf_00 = xmlAllocParserInputBuffer(XML_CHAR_ENCODING_NONE);
    if (buf_00 == (xmlParserInputBufferPtr)0x0) {
      url_local = (char *)0x0;
    }
    else {
      iVar1 = xmlInputFromFd(buf_00,fd,flags);
      if (iVar1 < 0) {
        xmlFreeParserInputBuffer(buf_00);
        url_local = (char *)0x0;
      }
      else {
        url_local = (char *)xmlNewInputInternal(buf_00,url);
      }
    }
  }
  return (xmlParserInputPtr)url_local;
}

Assistant:

xmlParserInputPtr
xmlNewInputFromFd(const char *url, int fd, int flags) {
    xmlParserInputBufferPtr buf;

    if (fd < 0)
	return(NULL);

    buf = xmlAllocParserInputBuffer(XML_CHAR_ENCODING_NONE);
    if (buf == NULL)
        return(NULL);

    if (xmlInputFromFd(buf, fd, flags) < 0) {
        xmlFreeParserInputBuffer(buf);
        return(NULL);
    }

    return(xmlNewInputInternal(buf, url));
}